

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::LSTMParams::Clear(LSTMParams *this)

{
  this->coupledinputandforgetgate_ = false;
  this->cellclipthreshold_ = 0.0;
  this->sequenceoutput_ = false;
  this->hasbiasvectors_ = false;
  this->forgetbias_ = false;
  this->haspeepholevectors_ = false;
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void LSTMParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.LSTMParams)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  ::memset(&cellclipthreshold_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&coupledinputandforgetgate_) -
      reinterpret_cast<char*>(&cellclipthreshold_)) + sizeof(coupledinputandforgetgate_));
  _internal_metadata_.Clear<std::string>();
}